

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Swap
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  
  if (other != this) {
    psVar3 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar3;
    psVar3 = this->insertion_point_;
    this->insertion_point_ = other->insertion_point_;
    other->insertion_point_ = psVar3;
    psVar3 = this->content_;
    this->content_ = other->content_;
    other->content_ = psVar3;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar4 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar4;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Swap(CodeGeneratorResponse_File* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(insertion_point_, other->insertion_point_);
    std::swap(content_, other->content_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}